

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O0

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path *path,xr_writer *w)

{
  size_type sVar1;
  xr_writer *w_local;
  way_path *path_local;
  way_path_io *this_local;
  
  xr_writer::w_chunk<unsigned_short>(w,1,&WAYOBJECT_VERSION);
  xr_writer::open_chunk(w,2);
  sVar1 = std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::size(&path->points);
  xr_writer::w_size_u16(w,sVar1);
  xr_writer::
  w_seq<std::vector<xray_re::way_point,std::allocator<xray_re::way_point>>,xray_re::way_point_io>
            (w,&path->points);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  sVar1 = std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::size(&path->links);
  xr_writer::w_size_u16(w,sVar1);
  xr_writer::
  w_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
            (w,&path->links);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,5);
  xr_writer::w_sz(w,&path->name);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void way_path_io::operator()(const way_path* path, xr_writer& w) const
{
	w.w_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, WAYOBJECT_VERSION);

	w.open_chunk(WAYOBJECT_CHUNK_POINTS);
	w.w_size_u16(path->points.size());
	w.w_seq(path->points, way_point_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_LINKS);
	w.w_size_u16(path->links.size());
	w.w_seq(path->links, way_link_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_NAME);
	w.w_sz(path->name);
	w.close_chunk();
}